

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::MutableRawImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  uint32_t uVar2;
  void *pvVar3;
  
  this_00 = &this->schema_;
  bVar1 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (!bVar1) {
    pvVar3 = MutableRawNonOneofImpl(this,message,field);
    return pvVar3;
  }
  bVar1 = internal::ReflectionSchema::IsSplit(this_00,field);
  if (!bVar1) {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    return (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  MutableRawImpl();
}

Assistant:

void* Reflection::MutableRawImpl(Message* message,
                                 const FieldDescriptor* field) const {
  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return MutableRawNonOneofImpl(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return GetPointerAtOffset<void>(message, field_offset);
}